

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O2

void __thiscall CVmBigNumCache::~CVmBigNumCache(CVmBigNumCache *this)

{
  CVmBigNumCacheReg *this_00;
  size_t sVar1;
  bool bVar2;
  
  this_00 = this->reg_;
  sVar1 = this->max_regs_;
  while (bVar2 = sVar1 != 0, sVar1 = sVar1 - 1, bVar2) {
    CVmBigNumCacheReg::free_mem(this_00);
    this_00 = this_00 + 1;
  }
  free(this->reg_);
  CVmBigNumCacheReg::free_mem(&this->ln10_);
  CVmBigNumCacheReg::free_mem(&this->ln2_);
  CVmBigNumCacheReg::free_mem(&this->pi_);
  CVmBigNumCacheReg::free_mem(&this->e_);
  CVmBigNumCacheReg::free_mem(&this->dbl_max_);
  CVmBigNumCacheReg::free_mem(&this->dbl_min_);
  return;
}

Assistant:

CVmBigNumCache::~CVmBigNumCache()
{
    CVmBigNumCacheReg *p;
    size_t i;

    /* delete each of our allocated registers */
    for (p = reg_, i = max_regs_ ; i != 0 ; ++p, --i)
        p->free_mem();

    /* free the register list array */
    t3free(reg_);

    /* free the constant value registers */
    ln10_.free_mem();
    ln2_.free_mem();
    pi_.free_mem();
    e_.free_mem();
    dbl_max_.free_mem();
    dbl_min_.free_mem();
}